

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O0

BindResult __thiscall
QOpenGLTextureCache::bindTexture
          (QOpenGLTextureCache *this,QOpenGLContext *context,QPixmap *pixmap,BindOptions options)

{
  bool bVar1;
  BindOptions lhs;
  ulong uVar2;
  qint64 key_00;
  QFlags<QOpenGLTextureUploader::BindOption> in_ECX;
  QPaintDevice *in_RDX;
  QOpenGLTextureCache *in_RSI;
  long in_FS_OFFSET;
  QOpenGLCachedTexture *entry;
  qint64 key;
  BindResult result;
  QMutexLocker<QMutex> locker;
  GLuint in_stack_ffffffffffffff38;
  GLenum in_stack_ffffffffffffff3c;
  QCache<unsigned_long_long,_QOpenGLCachedTexture> *in_stack_ffffffffffffff40;
  QOpenGLCachedTexture *in_stack_ffffffffffffff80;
  QImage local_50 [20];
  QFlagsStorage<QOpenGLTextureUploader::BindOption> in_stack_ffffffffffffffc4;
  BindResult local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QPixmap::isNull();
  if ((uVar2 & 1) != 0) {
    local_20 = (BindResult)((ulong)local_20 & 0xffffffff00000000);
    memset(&local_20.flags,0,4);
    QFlags<QOpenGLTextureCache::BindResultFlag>::QFlags
              ((QFlags<QOpenGLTextureCache::BindResultFlag> *)0x19f72e);
    goto LAB_0019f8f5;
  }
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  key_00 = QPixmap::cacheKey();
  bVar1 = QPaintDevice::paintingActive(in_RDX);
  if ((bVar1) ||
     (in_stack_ffffffffffffff80 =
           QCache<unsigned_long_long,_QOpenGLCachedTexture>::object
                     (in_stack_ffffffffffffff40,
                      (unsigned_long_long *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
     in_stack_ffffffffffffff80 == (QOpenGLCachedTexture *)0x0)) {
LAB_0019f85f:
    local_20.id = 0xaaaaaaaa;
    local_20.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
    super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
         (QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>)0xaaaaaaaa;
    QPixmap::toImage();
    local_20 = bindTexture(in_RSI,(QOpenGLContext *)in_RDX,key_00,
                           (QImage *)in_stack_ffffffffffffff80,
                           (BindOptions)in_stack_ffffffffffffffc4.i);
    QImage::~QImage(local_50);
    if (local_20.id != 0) {
      QImagePixmapCleanupHooks::enableCleanupHooks((QPixmap *)in_RDX);
    }
  }
  else {
    lhs = QOpenGLCachedTexture::options((QOpenGLCachedTexture *)in_stack_ffffffffffffff40);
    bVar1 = ::operator==((QFlags<QOpenGLTextureUploader::BindOption>)
                         lhs.super_QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>.
                         super_QFlagsStorage<QOpenGLTextureUploader::BindOption>.i,in_ECX);
    if (!bVar1) goto LAB_0019f85f;
    QOpenGLContext::functions();
    QOpenGLCachedTexture::id((QOpenGLCachedTexture *)0x19f807);
    QOpenGLFunctions::glBindTexture
              ((QOpenGLFunctions *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               in_stack_ffffffffffffff38);
    local_20.id = QOpenGLCachedTexture::id((QOpenGLCachedTexture *)0x19f822);
    memset(&local_20.flags,0,4);
    QFlags<QOpenGLTextureCache::BindResultFlag>::QFlags
              ((QFlags<QOpenGLTextureCache::BindResultFlag> *)0x19f850);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40);
LAB_0019f8f5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

QOpenGLTextureCache::BindResult QOpenGLTextureCache::bindTexture(QOpenGLContext *context,
                                                                 const QPixmap &pixmap,
                                                                 QOpenGLTextureUploader::BindOptions options)
{
    if (pixmap.isNull())
        return { 0, {} };
    QMutexLocker locker(&m_mutex);
    qint64 key = pixmap.cacheKey();

    // A QPainter is active on the image - take the safe route and replace the texture.
    if (!pixmap.paintingActive()) {
        QOpenGLCachedTexture *entry = m_cache.object(key);
        if (entry && entry->options() == options) {
            context->functions()->glBindTexture(GL_TEXTURE_2D, entry->id());
            return { entry->id(), {} };
        }
    }

    BindResult result = bindTexture(context, key, pixmap.toImage(), options);
    if (result.id > 0)
        QImagePixmapCleanupHooks::enableCleanupHooks(pixmap);

    return result;
}